

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
yy::mylanguage_parser::basic_symbol<yy::mylanguage_parser::by_kind>::basic_symbol
          (basic_symbol<yy::mylanguage_parser::by_kind> *this,kind_type t,string *v,location_type *l
          )

{
  counter_type cVar1;
  location_type *l_local;
  string *v_local;
  kind_type t_local;
  basic_symbol<yy::mylanguage_parser::by_kind> *this_local;
  
  by_kind::by_kind(&this->super_by_kind,t);
  value_type::value_type<std::__cxx11::string>(&this->value,v);
  (this->location).begin.filename = (l->begin).filename;
  cVar1 = (l->begin).column;
  (this->location).begin.line = (l->begin).line;
  (this->location).begin.column = cVar1;
  (this->location).end.filename = (l->end).filename;
  cVar1 = (l->end).column;
  (this->location).end.line = (l->end).line;
  (this->location).end.column = cVar1;
  return;
}

Assistant:

basic_symbol (typename Base::kind_type t, std::string&& v, location_type&& l)
        : Base (t)
        , value (std::move (v))
        , location (std::move (l))
      {}